

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v7::detail::dragonbox::divisible_by_power_of_2(uint64_t x,int exp)

{
  int iVar1;
  int exp_local;
  uint64_t x_local;
  
  iVar1 = 0;
  for (; (x & 1) == 0; x = x >> 1 | 0x8000000000000000) {
    iVar1 = iVar1 + 1;
  }
  return exp <= iVar1;
}

Assistant:

inline bool divisible_by_power_of_2(uint64_t x, int exp) FMT_NOEXCEPT {
  FMT_ASSERT(exp >= 1, "");
  FMT_ASSERT(x != 0, "");
#ifdef FMT_BUILTIN_CTZLL
  return FMT_BUILTIN_CTZLL(x) >= exp;
#else
  return exp < num_bits<uint64_t>() && x == ((x >> exp) << exp);
#endif
}